

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_type_test.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_62009::FieldTypeTest_TestValueOfCodeReturnsSameFieldType_Test::TestBody
          (FieldTypeTest_TestValueOfCodeReturnsSameFieldType_Test *this)

{
  internal iVar1;
  bool bVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30;
  AssertHelper local_28;
  internal local_20 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  
  local_30.ptr_._0_1_ = 0x44;
  local_28.data_._0_1_ = bidfx_public_api::price::pixie::FieldTypeMethods::ValueOf(0x44);
  testing::internal::
  CmpHelperEQ<bidfx_public_api::price::pixie::FieldTypeEnum,bidfx_public_api::price::pixie::FieldTypeEnum>
            (local_20,"FieldTypeEnum::DOUBLE",
             "FieldTypeMethods::ValueOf((int) FieldTypeEnum::DOUBLE)",(FieldTypeEnum *)&local_30,
             (FieldTypeEnum *)&local_28);
  iVar1 = local_20[0];
  if (local_20[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_18.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_18.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_28,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/field_type_test.cpp"
               ,0x1b,pcVar3);
    testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_28);
    if (local_30.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         (local_30.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_30.ptr_ + 8))();
      }
      local_30.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (iVar1 != (internal)0x0) {
    local_30.ptr_._0_1_ = 0x49;
    local_28.data_._0_1_ = bidfx_public_api::price::pixie::FieldTypeMethods::ValueOf(0x49);
    testing::internal::
    CmpHelperEQ<bidfx_public_api::price::pixie::FieldTypeEnum,bidfx_public_api::price::pixie::FieldTypeEnum>
              (local_20,"FieldTypeEnum::INTEGER",
               "FieldTypeMethods::ValueOf((int) FieldTypeEnum::INTEGER)",(FieldTypeEnum *)&local_30,
               (FieldTypeEnum *)&local_28);
    iVar1 = local_20[0];
    if (local_20[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_30);
      if (local_18.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
      {
        pcVar3 = "";
      }
      else {
        pcVar3 = ((local_18.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_28,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/field_type_test.cpp"
                 ,0x1c,pcVar3);
      testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
      testing::internal::AssertHelper::~AssertHelper(&local_28);
      if (local_30.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        bVar2 = testing::internal::IsTrue(true);
        if ((bVar2) &&
           (local_30.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_30.ptr_ + 8))();
        }
        local_30.ptr_ =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    if (iVar1 != (internal)0x0) {
      local_30.ptr_._0_1_ = 0x4c;
      local_28.data_._0_1_ = bidfx_public_api::price::pixie::FieldTypeMethods::ValueOf(0x4c);
      testing::internal::
      CmpHelperEQ<bidfx_public_api::price::pixie::FieldTypeEnum,bidfx_public_api::price::pixie::FieldTypeEnum>
                (local_20,"FieldTypeEnum::LONG",
                 "FieldTypeMethods::ValueOf((int) FieldTypeEnum::LONG)",(FieldTypeEnum *)&local_30,
                 (FieldTypeEnum *)&local_28);
      iVar1 = local_20[0];
      if (local_20[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_30);
        if (local_18.ptr_ ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar3 = "";
        }
        else {
          pcVar3 = ((local_18.ptr_)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_28,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/field_type_test.cpp"
                   ,0x1d,pcVar3);
        testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
        testing::internal::AssertHelper::~AssertHelper(&local_28);
        if (local_30.ptr_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          bVar2 = testing::internal::IsTrue(true);
          if ((bVar2) &&
             (local_30.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
            (**(code **)(*(long *)local_30.ptr_ + 8))();
          }
          local_30.ptr_ =
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      if (iVar1 != (internal)0x0) {
        local_30.ptr_._0_1_ = 0x53;
        local_28.data_._0_1_ = bidfx_public_api::price::pixie::FieldTypeMethods::ValueOf(0x53);
        testing::internal::
        CmpHelperEQ<bidfx_public_api::price::pixie::FieldTypeEnum,bidfx_public_api::price::pixie::FieldTypeEnum>
                  (local_20,"FieldTypeEnum::STRING",
                   "FieldTypeMethods::ValueOf((int) FieldTypeEnum::STRING)",
                   (FieldTypeEnum *)&local_30,(FieldTypeEnum *)&local_28);
        if (local_20[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_30);
          if (local_18.ptr_ ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar3 = "";
          }
          else {
            pcVar3 = ((local_18.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_28,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/fields/field_type_test.cpp"
                     ,0x1e,pcVar3);
          testing::internal::AssertHelper::operator=(&local_28,(Message *)&local_30);
          testing::internal::AssertHelper::~AssertHelper(&local_28);
          if (local_30.ptr_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            bVar2 = testing::internal::IsTrue(true);
            if ((bVar2) &&
               (local_30.ptr_ !=
                (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
              (**(code **)(*(long *)local_30.ptr_ + 8))();
            }
            local_30.ptr_ =
                 (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
          }
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset(&local_18,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      }
    }
  }
  return;
}

Assistant:

TEST(FieldTypeTest, TestValueOfCodeReturnsSameFieldType)
{
    ASSERT_EQ(FieldTypeEnum::DOUBLE, FieldTypeMethods::ValueOf((int) FieldTypeEnum::DOUBLE));
    ASSERT_EQ(FieldTypeEnum::INTEGER, FieldTypeMethods::ValueOf((int) FieldTypeEnum::INTEGER));
    ASSERT_EQ(FieldTypeEnum::LONG, FieldTypeMethods::ValueOf((int) FieldTypeEnum::LONG));
    ASSERT_EQ(FieldTypeEnum::STRING, FieldTypeMethods::ValueOf((int) FieldTypeEnum::STRING));
}